

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * cfd::js::api::json::JsonMappingApi::AdaptEcdsaAdaptor
                   (string *__return_storage_ptr__,string *request_message)

{
  function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::AdaptEcdsaAdaptorRequestStruct_&)>
  *in_RCX;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_28._8_8_ = 0;
  local_28._0_8_ = SchnorrApi::AdaptEcdsaAdaptor;
  local_18._8_8_ =
       std::
       _Function_handler<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::AdaptEcdsaAdaptorRequestStruct_&),_cfd::js::api::SignatureDataResponseStruct_(*)(const_cfd::js::api::AdaptEcdsaAdaptorRequestStruct_&)>
       ::_M_invoke;
  local_18._0_8_ =
       std::
       _Function_handler<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::AdaptEcdsaAdaptorRequestStruct_&),_cfd::js::api::SignatureDataResponseStruct_(*)(const_cfd::js::api::AdaptEcdsaAdaptorRequestStruct_&)>
       ::_M_manager;
  ExecuteJsonApi<cfd::js::api::json::AdaptEcdsaAdaptorRequest,cfd::js::api::json::SignatureDataResponse,cfd::js::api::AdaptEcdsaAdaptorRequestStruct,cfd::js::api::SignatureDataResponseStruct>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,in_RCX);
  if ((code *)local_18._0_8_ != (code *)0x0) {
    (*(code *)local_18._0_8_)(local_28,local_28,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::AdaptEcdsaAdaptor(
    const std::string &request_message) {
  return ExecuteJsonApi<
      AdaptEcdsaAdaptorRequest, SignatureDataResponse,
      AdaptEcdsaAdaptorRequestStruct, SignatureDataResponseStruct>(
      request_message, SchnorrApi::AdaptEcdsaAdaptor);
}